

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

void time_map_fetch<EasyUseHashMap<HashObject<256,32>,int,HashFn>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  double t_00;
  uint *puVar1;
  iterator iVar2;
  size_t in_RCX;
  size_t start_memory;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Rusage t;
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> set;
  key_type local_130;
  
  set.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_buckets =
       &set.
        super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
        ._M_h._M_single_bucket;
  set.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_bucket_count = 1;
  set.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_element_count = 0;
  set.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  set.
  super_unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Rusage::Rusage(&t);
  uVar4 = 0;
  uVar3 = 0;
  if (0 < iters) {
    uVar3 = iters;
  }
  while (uVar3 != uVar4) {
    local_130.i_ = uVar4;
    memset(local_130.buffer_,uVar4,0xfc);
    puVar1 = (uint *)std::__detail::
                     _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,&local_130);
    uVar4 = uVar4 + 1;
    *puVar1 = uVar4;
  }
  Rusage::Reset(&t);
  uVar4 = 1;
  for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    local_130.i_ = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5];
    memset(local_130.buffer_,local_130.i_,0xfc);
    iVar2 = std::
            _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&set,&local_130);
    in_RCX = (size_t)(iVar2.
                      super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>.
                      _M_cur != (__node_type *)0x0);
    uVar4 = uVar4 ^ iVar2.super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>
                    ._M_cur != (__node_type *)0x0;
  }
  t_00 = Rusage::UserTime(&t);
  srand(uVar4);
  report(title,t_00,iters,start_memory,in_RCX);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}